

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * __thiscall tcu::Format::Bitfield<32UL>::toStream(Bitfield<32UL> *this,ostream *stream)

{
  deUint64 stream_00;
  Hex<8UL> local_30;
  BitDesc *local_28;
  BitDesc *curDesc;
  deUint64 bitsLeft;
  ostream *stream_local;
  Bitfield<32UL> *this_local;
  
  curDesc = (BitDesc *)this->m_value;
  bitsLeft = (deUint64)stream;
  stream_local = (ostream *)this;
  for (local_28 = this->m_begin; local_28 != this->m_end; local_28 = local_28 + 1) {
    if ((local_28->bit & (ulong)curDesc) != 0) {
      if (curDesc != (BitDesc *)this->m_value) {
        std::operator<<((ostream *)bitsLeft,"|");
      }
      std::operator<<((ostream *)bitsLeft,local_28->name);
      curDesc = (BitDesc *)(local_28->bit ^ (ulong)curDesc);
    }
  }
  if (curDesc != (BitDesc *)0x0) {
    if (curDesc != (BitDesc *)this->m_value) {
      std::operator<<((ostream *)bitsLeft,"|");
    }
    stream_00 = bitsLeft;
    Hex<8UL>::Hex(&local_30,(deUint64)curDesc);
    Format::operator<<((ostream *)stream_00,local_30);
  }
  return (ostream *)bitsLeft;
}

Assistant:

std::ostream& toStream (std::ostream& stream)
	{
		deUint64 bitsLeft = m_value;
		for (const BitDesc* curDesc = m_begin; curDesc != m_end; curDesc++)
		{
			if (curDesc->bit & bitsLeft)
			{
				if (bitsLeft != m_value)
					stream << "|";
				stream << curDesc->name;
				bitsLeft ^= curDesc->bit;
			}
		}

		if (bitsLeft != 0)
		{
			if (bitsLeft != m_value)
				stream << "|";
			stream << Hex<BitfieldSize/4>(bitsLeft);
		}

		return stream;
	}